

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rate_adaptive_code.hpp
# Opt level: O1

void __thiscall
LDPC4QKD::RateAdaptiveCode<unsigned_int>::RateAdaptiveCode<unsigned_int>
          (RateAdaptiveCode<unsigned_int> *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *colptr,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *rowIdx,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *rows_to_combine_rate_adapt,
          uint initial_row_combs)

{
  uint *puVar1;
  uint *puVar2;
  ulong uVar3;
  domain_error *this_00;
  uint *puVar4;
  uint *puVar5;
  
  puVar5 = (rowIdx->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (rowIdx->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar4 = puVar5 + 1;
  if (puVar4 != puVar1 && puVar5 != puVar1) {
    do {
      puVar2 = puVar4;
      if (*puVar4 <= *puVar5) {
        puVar2 = puVar5;
      }
      puVar5 = puVar2;
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar1);
  }
  this->n_mother_rows = (ulong)(*puVar5 + 1);
  this->n_cols = ((long)(colptr->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(colptr->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start >> 2) - 1;
  compute_mother_pos_varn<unsigned_int>(&this->mother_pos_varn,colptr,rowIdx);
  (this->rows_to_combine).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (rows_to_combine_rate_adapt->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
       ._M_impl.super__Vector_impl_data._M_start;
  (this->rows_to_combine).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (rows_to_combine_rate_adapt->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->rows_to_combine).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (rows_to_combine_rate_adapt->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (rows_to_combine_rate_adapt->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (rows_to_combine_rate_adapt->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (rows_to_combine_rate_adapt->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->n_ra_rows = 0;
  (this->pos_varn).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pos_varn).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pos_checkn).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pos_varn).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pos_checkn).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pos_checkn).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar3 = (long)(this->rows_to_combine).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->rows_to_combine).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
  if ((uVar3 & 4) == 0) {
    if ((ulong)initial_row_combs <= (ulong)((long)uVar3 >> 2) >> 1) {
      recompute_pos_vn_cn(this,(ulong)initial_row_combs);
      return;
    }
    this_00 = (domain_error *)__cxa_allocate_exception(0x10);
    std::domain_error::domain_error
              (this_00,
               "The number of desired initial row combinations for rate adaption is larger than the given array of lines to combine."
              );
  }
  else {
    this_00 = (domain_error *)__cxa_allocate_exception(0x10);
    std::domain_error::domain_error
              (this_00,
               "The number of rows to combine for rate adaption (size of argument array) is an odd number (expected even)."
              );
  }
  __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

RateAdaptiveCode(std::vector<colptr_t> colptr,
                         std::vector<idx_t> rowIdx,
                         std::vector<idx_t> rows_to_combine_rate_adapt,
                         idx_t initial_row_combs = 0)
                : n_mother_rows(*std::max_element(rowIdx.begin(), rowIdx.end()) + 1u),
                  n_cols(colptr.size() - 1),
                  mother_pos_varn(compute_mother_pos_varn(colptr, rowIdx)), // computed here and henceforth `const`!
                  rows_to_combine(std::move(rows_to_combine_rate_adapt)) {
            if (rows_to_combine.size() % 2 != 0) {
                throw std::domain_error("The number of rows to combine for rate adaption "
                                        "(size of argument array) is an odd number (expected even).");
            }

            if (initial_row_combs > rows_to_combine.size() / 2) {
                throw std::domain_error("The number of desired initial row combinations for rate adaption "
                                        "is larger than the given array of lines to combine.");
            }

            // compute current `pos_varn` and `pos_checkn` from `mother_pos_varn`
            recompute_pos_vn_cn(initial_row_combs);
        }